

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

void luaL_addvalue(luaL_Buffer *B)

{
  int iVar1;
  lua_State *L_00;
  long *in_RDI;
  char *s;
  size_t vl;
  lua_State *L;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  size_t *in_stack_ffffffffffffffe0;
  undefined4 local_18;
  int in_stack_ffffffffffffffec;
  luaL_Buffer *B_00;
  
  B_00 = (luaL_Buffer *)in_RDI[2];
  L_00 = (lua_State *)
         lua_tolstring((lua_State *)B_00,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0);
  if (0x2000U - (*in_RDI - (long)(in_RDI + 3)) < CONCAT44(in_stack_ffffffffffffffec,local_18)) {
    iVar1 = emptybuffer((luaL_Buffer *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                       );
    if (iVar1 != 0) {
      lua_insert((lua_State *)B_00,in_stack_ffffffffffffffec);
    }
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 1;
    adjuststack(B_00);
  }
  else {
    memcpy((void *)*in_RDI,L_00,CONCAT44(in_stack_ffffffffffffffec,local_18));
    *in_RDI = CONCAT44(in_stack_ffffffffffffffec,local_18) + *in_RDI;
    lua_settop(L_00,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

LUALIB_API void luaL_addvalue(luaL_Buffer *B)
{
  lua_State *L = B->L;
  size_t vl;
  const char *s = lua_tolstring(L, -1, &vl);
  if (vl <= bufffree(B)) {  /* fit into buffer? */
    memcpy(B->p, s, vl);  /* put it there */
    B->p += vl;
    lua_pop(L, 1);  /* remove from stack */
  } else {
    if (emptybuffer(B))
      lua_insert(L, -2);  /* put buffer before new value */
    B->lvl++;  /* add new value into B stack */
    adjuststack(B);
  }
}